

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O1

void __thiscall
crnlib::dxt1_endpoint_optimizer::optimize_endpoint_comps(dxt1_endpoint_optimizer *this)

{
  dxt1_endpoint_optimizer *pdVar1;
  byte bVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  byte bVar8;
  sbyte sVar9;
  byte bVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  color_quad_u8 high;
  color_quad_u8 low;
  color_quad_u8 source_high;
  color_quad_u8 source_low;
  uint64 best_remaining_error [4];
  uint64 error [4] [256];
  undefined1 local_20a8 [10];
  uint16 local_209e;
  dxt1_solution_coordinates local_209c;
  ulong local_2098;
  long local_2090;
  ulong local_2088;
  uint local_207c;
  undefined1 local_2078 [8];
  dxt1_endpoint_optimizer *local_2070;
  long local_2068;
  ulong local_2060;
  ulong local_2058;
  uint64 local_2050;
  uint64 local_2048;
  uint64 local_2040;
  uint64 local_2038 [256];
  long alStack_1838 [256];
  long alStack_1038 [256];
  long alStack_838 [257];
  
  if (this->m_evaluate_hc == true) {
    compute_selectors_hc(this);
  }
  if (((this->m_best_solution).m_alpha_block == false) && ((this->m_best_solution).m_error != 0)) {
    dxt1_block::unpack_color
              ((dxt1_block *)(local_2078 + 4),(this->m_best_solution).m_coords.m_low_color,true,0xff
              );
    dxt1_block::unpack_color
              ((dxt1_block *)local_2078,(this->m_best_solution).m_coords.m_high_color,true,0xff);
    lVar12 = 0;
    local_2070 = this;
    do {
      pdVar1 = local_2070;
      bVar10 = local_2078[lVar12 + 4];
      bVar2 = local_2078[lVar12];
      dxt1_block::unpack_color
                ((dxt1_block *)(local_20a8 + 4),(local_2070->m_best_solution).m_coords.m_low_color,
                 false,0xff);
      dxt1_block::unpack_color
                ((dxt1_block *)local_20a8,(pdVar1->m_best_solution).m_coords.m_high_color,false,0xff
                );
      compute_endpoint_component_errors
                (pdVar1,(uint)lVar12,(uint64 (*) [4] [256])local_2038,(uint64 (*) [4])&local_2058);
      uVar16 = alStack_1838[(byte)local_20a8[lVar12]] +
               alStack_1838[(ulong)(byte)local_20a8[lVar12 + 4] - 0x100] +
               alStack_1038[(ulong)((uint)bVar2 + (uint)bVar10 * 2) / 3] +
               alStack_838[(ulong)((uint)bVar10 + (uint)bVar2 * 2) / 3];
      uVar7 = 0;
      if (local_2058 < uVar16) {
        bVar17 = lVar12 == 1;
        bVar10 = bVar17 * ' ' + 0x20;
        sVar9 = bVar17 * '\x02' + 2;
        uVar6 = 0;
        local_2090 = lVar12;
        do {
          bVar2 = (byte)uVar6;
          lVar11 = alStack_1838[(uVar6 & 0xff) - 0x100];
          uVar7 = 7;
          if (local_2050 + lVar11 < uVar16) {
            local_2060 = uVar6 & 0xff;
            local_20a8[lVar12 + 4] = bVar2;
            local_209e = dxt1_block::pack_color((color_quad_u8 *)(local_20a8 + 4),false,0x7f);
            local_207c = (uint)uVar6;
            bVar2 = bVar2 >> sVar9 | bVar2 << (bVar17 ^ 3U);
            uVar6 = (ulong)bVar2;
            uVar13 = (ulong)((uint)bVar2 * 2);
            lVar15 = 0;
            local_2088 = uVar6;
            local_2098 = uVar13;
            do {
              uVar7 = 10;
              if (local_2048 + alStack_1838[lVar15] + lVar11 < uVar16) {
                bVar2 = (byte)lVar15;
                bVar8 = bVar2 >> sVar9 | bVar2 << (bVar17 ^ 3U);
                uVar5 = (ulong)((uint)bVar8 + (int)uVar13) * 0x55555556 >> 0x20;
                lVar4 = alStack_1838[lVar15] + lVar11 + alStack_1038[uVar5];
                if ((local_2040 + lVar4 < uVar16) &&
                   (uVar14 = (ulong)((int)uVar6 + (uint)bVar8 * 2) * 0x55555556 >> 0x20,
                   uVar13 = local_2098, (ulong)(lVar4 + alStack_838[uVar14]) < uVar16)) {
                  local_2068 = lVar11;
                  local_20a8[lVar12] = bVar2;
                  local_209c.m_high_color =
                       dxt1_block::pack_color((color_quad_u8 *)local_20a8,false,0x7f);
                  pdVar1 = local_2070;
                  local_209c.m_low_color = local_209e;
                  bVar3 = evaluate_solution(local_2070,&local_209c,false);
                  lVar12 = local_2090;
                  lVar11 = local_2068;
                  uVar6 = local_2088;
                  uVar13 = local_2098;
                  if (bVar3) {
                    if ((pdVar1->m_best_solution).m_error == 0) {
                      uVar7 = 1;
                    }
                    else {
                      if (pdVar1->m_evaluate_hc == true) {
                        compute_selectors_hc(pdVar1);
                      }
                      compute_endpoint_component_errors
                                (pdVar1,(uint)lVar12,(uint64 (*) [4] [256])local_2038,
                                 (uint64 (*) [4])&local_2058);
                      lVar11 = alStack_1838[local_2060 - 0x100];
                      uVar16 = alStack_1838[lVar15] + lVar11 + alStack_1038[uVar5] +
                               alStack_838[uVar14];
                      uVar7 = (uint)(uVar16 <= local_2050 + lVar11) << 3;
                      uVar6 = local_2088;
                      uVar13 = local_2098;
                    }
                  }
                }
              }
              if ((uVar7 != 10) && (uVar7 != 0)) goto LAB_0016c257;
              lVar15 = lVar15 + 1;
            } while ((byte)lVar15 < bVar10);
            uVar7 = 8;
LAB_0016c257:
            if (uVar7 == 8) {
              uVar7 = 0;
            }
            uVar6 = (ulong)local_207c;
          }
          if ((uVar7 != 7) && (uVar7 != 0)) goto LAB_0016c27f;
          bVar2 = (char)uVar6 + 1;
          uVar6 = CONCAT71((int7)(uVar6 >> 8),bVar2);
        } while (bVar2 < bVar10);
        uVar7 = 5;
LAB_0016c27f:
        if (uVar7 == 5) {
          uVar7 = 0;
        }
      }
    } while (((uVar7 & 0xb) == 0) && (lVar12 = lVar12 + 1, lVar12 != 3));
  }
  return;
}

Assistant:

void dxt1_endpoint_optimizer::optimize_endpoint_comps()
    {
        compute_selectors();
        if (m_best_solution.m_alpha_block || !m_best_solution.m_error)
        {
            return;
        }
        color_quad_u8 source_low(dxt1_block::unpack_color(m_best_solution.m_coords.m_low_color, true));
        color_quad_u8 source_high(dxt1_block::unpack_color(m_best_solution.m_coords.m_high_color, true));
        uint64 error[4][256], best_remaining_error[4];
        for (uint comp_index = 0; comp_index < 3; comp_index++)
        {
            uint8 p0 = source_low[comp_index];
            uint8 p1 = source_high[comp_index];
            color_quad_u8 low(dxt1_block::unpack_color(m_best_solution.m_coords.m_low_color, false));
            color_quad_u8 high(dxt1_block::unpack_color(m_best_solution.m_coords.m_high_color, false));
            compute_endpoint_component_errors(comp_index, error, best_remaining_error);
            uint64 best_error = error[0][low[comp_index]] + error[1][high[comp_index]] + error[2][(p0 * 2 + p1) / 3] + error[3][(p0 + p1 * 2) / 3];
            if (best_remaining_error[0] >= best_error)
            {
                continue;
            }
            const uint comp_limit = comp_index == 1 ? 64 : 32;
            for (uint8 c0 = 0; c0 < comp_limit; c0++)
            {
                uint64 e0 = error[0][c0];
                if (e0 + best_remaining_error[1] >= best_error)
                {
                    continue;
                }
                low[comp_index] = c0;
                uint16 packed_low = dxt1_block::pack_color(low, false);
                p0 = comp_index == 1 ? c0 << 2 | c0 >> 4 : c0 << 3 | c0 >> 2;
                for (uint8 c1 = 0; c1 < comp_limit; c1++)
                {
                    uint64 e = e0 + error[1][c1];
                    if (e + best_remaining_error[2] >= best_error)
                    {
                        continue;
                    }
                    p1 = comp_index == 1 ? c1 << 2 | c1 >> 4 : c1 << 3 | c1 >> 2;
                    e += error[2][(p0 * 2 + p1) / 3];
                    if (e + best_remaining_error[3] >= best_error)
                    {
                        continue;
                    }
                    e += error[3][(p0 + p1 * 2) / 3];
                    if (e >= best_error)
                    {
                        continue;
                    }
                    high[comp_index] = c1;
                    if (!evaluate_solution(dxt1_solution_coordinates(packed_low, dxt1_block::pack_color(high, false))))
                    {
                        continue;
                    }
                    if (!m_best_solution.m_error)
                    {
                        return;
                    }
                    compute_selectors();
                    compute_endpoint_component_errors(comp_index, error, best_remaining_error);
                    best_error = error[0][c0] + error[1][c1] + error[2][(p0 * 2 + p1) / 3] + error[3][(p0 + p1 * 2) / 3];
                    e0 = error[0][c0];
                    if (e0 + best_remaining_error[1] >= best_error)
                    {
                        break;
                    }
                }
            }
        }
    }